

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall
edition_unittest::TestVerifyBigFieldNumberUint32_Nested::Clear
          (TestVerifyBigFieldNumberUint32_Nested *this)

{
  uint32_t *puVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_1d;
  uint local_1c;
  TestVerifyBigFieldNumberUint32_Nested *pTStack_18;
  uint32_t cached_has_bits;
  TestVerifyBigFieldNumberUint32_Nested *this_local;
  
  this_local = (TestVerifyBigFieldNumberUint32_Nested *)&this->field_0;
  local_1c = 0;
  pTStack_18 = this;
  google::protobuf::RepeatedPtrField<edition_unittest::TestVerifyBigFieldNumberUint32_Nested>::Clear
            (&(this->field_0)._impl_.repeated_nested_);
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_1c = *puVar1;
  if ((local_1c & 1) != 0) {
    if ((this->field_0)._impl_.optional_nested_ == (TestVerifyBigFieldNumberUint32_Nested *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                 ,0xcb85,"_impl_.optional_nested_ != nullptr");
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_30);
    }
    Clear((this->field_0)._impl_.optional_nested_);
  }
  if ((local_1c & 0xfe) != 0) {
    memset((void *)((long)&this->field_0 + 0x28),0,0x1c);
  }
  (this->field_0)._impl_.optional_uint32_5000_ = 0;
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestVerifyBigFieldNumberUint32_Nested::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestVerifyBigFieldNumberUint32.Nested)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_nested_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    ABSL_DCHECK(_impl_.optional_nested_ != nullptr);
    _impl_.optional_nested_->Clear();
  }
  if ((cached_has_bits & 0x000000feu) != 0) {
    ::memset(&_impl_.optional_uint32_1_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_uint32_1000_) -
        reinterpret_cast<char*>(&_impl_.optional_uint32_1_)) + sizeof(_impl_.optional_uint32_1000_));
  }
  _impl_.optional_uint32_5000_ = 0u;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}